

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O2

int IDASVtolerances(void *ida_mem,sunrealtype reltol,N_Vector abstol)

{
  undefined8 uVar1;
  int line;
  int error_code;
  char *msgfmt;
  double dVar2;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x2cf;
  }
  else if (*(int *)((long)ida_mem + 0x3d0) == 0) {
    msgfmt = "Attempt to call before IDAMalloc.";
    error_code = -0x17;
    line = 0x2d6;
  }
  else if (0.0 <= reltol) {
    dVar2 = (double)N_VMin(abstol);
    if (0.0 <= dVar2) {
      if (*(int *)((long)ida_mem + 0x3c4) == 0) {
        uVar1 = N_VClone(*(undefined8 *)((long)ida_mem + 0x180));
        *(undefined8 *)((long)ida_mem + 0x38) = uVar1;
        *(long *)((long)ida_mem + 0x3a8) =
             *(long *)((long)ida_mem + 0x3a8) + *(long *)((long)ida_mem + 0x398);
        *(long *)((long)ida_mem + 0x3b0) =
             *(long *)((long)ida_mem + 0x3b0) + *(long *)((long)ida_mem + 0x3a0);
        *(undefined4 *)((long)ida_mem + 0x3c4) = 1;
      }
      else {
        uVar1 = *(undefined8 *)((long)ida_mem + 0x38);
      }
      *(sunrealtype *)((long)ida_mem + 0x28) = reltol;
      N_VScale(0x3ff0000000000000,abstol,uVar1);
      *(uint *)((long)ida_mem + 0x40) = -(uint)(dVar2 == 0.0) & 1;
      *(undefined4 *)((long)ida_mem + 0x20) = 2;
      *(undefined4 *)((long)ida_mem + 0x44) = 0;
      *(code **)((long)ida_mem + 0x48) = IDAEwtSet;
      *(undefined8 *)((long)ida_mem + 0x50) = 0;
      return 0;
    }
    msgfmt = "Some atol component < 0.0 illegal.";
    error_code = -0x16;
    line = 0x2e7;
  }
  else {
    msgfmt = "rtol < 0 illegal.";
    error_code = -0x16;
    line = 0x2df;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASVtolerances",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASVtolerances(void* ida_mem, sunrealtype reltol, N_Vector abstol)
{
  IDAMem IDA_mem;
  sunrealtype atolmin;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    return (IDA_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RTOL);
    return (IDA_ILL_INPUT);
  }

  atolmin = N_VMin(abstol);
  if (atolmin < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ATOL);
    return (IDA_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  if (!(IDA_mem->ida_VatolMallocDone))
  {
    IDA_mem->ida_Vatol = N_VClone(IDA_mem->ida_ewt);
    IDA_mem->ida_lrw += IDA_mem->ida_lrw1;
    IDA_mem->ida_liw += IDA_mem->ida_liw1;
    IDA_mem->ida_VatolMallocDone = SUNTRUE;
  }

  IDA_mem->ida_rtol = reltol;
  N_VScale(ONE, abstol, IDA_mem->ida_Vatol);
  IDA_mem->ida_atolmin0 = (atolmin == ZERO);

  IDA_mem->ida_itol = IDA_SV;

  IDA_mem->ida_user_efun = SUNFALSE;
  IDA_mem->ida_efun      = IDAEwtSet;
  IDA_mem->ida_edata     = NULL; /* will be set to ida_mem in InitialSetup */

  return (IDA_SUCCESS);
}